

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskContainer.cpp
# Opt level: O0

vector<IContainedElement_*,_std::allocator<IContainedElement_*>_> * __thiscall
DataContainer::GetFileList
          (vector<IContainedElement_*,_std::allocator<IContainedElement_*>_> *__return_storage_ptr__
          ,DataContainer *this)

{
  bool bVar1;
  int iVar2;
  reference ppIVar3;
  __normal_iterator<IContainedElement_**,_std::vector<IContainedElement_*,_std::allocator<IContainedElement_*>_>_>
  local_30;
  __normal_iterator<IContainedElement_**,_std::vector<IContainedElement_*,_std::allocator<IContainedElement_*>_>_>
  local_28;
  iterator it;
  DataContainer *this_local;
  vector<IContainedElement_*,_std::allocator<IContainedElement_*>_> *out_list;
  
  it._M_current._7_1_ = 0;
  std::vector<IContainedElement_*,_std::allocator<IContainedElement_*>_>::vector
            (__return_storage_ptr__);
  local_28._M_current =
       (IContainedElement **)
       std::vector<IContainedElement_*,_std::allocator<IContainedElement_*>_>::begin
                 (&this->file_list_);
  while( true ) {
    local_30._M_current =
         (IContainedElement **)
         std::vector<IContainedElement_*,_std::allocator<IContainedElement_*>_>::end
                   (&this->file_list_);
    bVar1 = __gnu_cxx::operator<(&local_28,&local_30);
    if (!bVar1) break;
    ppIVar3 = __gnu_cxx::
              __normal_iterator<IContainedElement_**,_std::vector<IContainedElement_*,_std::allocator<IContainedElement_*>_>_>
              ::operator*(&local_28);
    iVar2 = (*(*ppIVar3)->_vptr_IContainedElement[2])();
    if (iVar2 != 0) {
      ppIVar3 = __gnu_cxx::
                __normal_iterator<IContainedElement_**,_std::vector<IContainedElement_*,_std::allocator<IContainedElement_*>_>_>
                ::operator*(&local_28);
      std::vector<IContainedElement_*,_std::allocator<IContainedElement_*>_>::push_back
                (__return_storage_ptr__,ppIVar3);
    }
    __gnu_cxx::
    __normal_iterator<IContainedElement_**,_std::vector<IContainedElement_*,_std::allocator<IContainedElement_*>_>_>
    ::operator++(&local_28);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<IContainedElement*> DataContainer::GetFileList()
{
   std::vector<IContainedElement*> out_list;

   //
   for (std::vector<IContainedElement*>::iterator it = file_list_.begin(); it < file_list_.end(); ++it)
   {
      if ((*it)->GetType() != 0)
      {
         out_list.push_back(*it);
      }
   }

   return out_list;
}